

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# myString.cpp
# Opt level: O3

myString * __thiscall myString::operator=(myString *this,myString *right)

{
  uint uVar1;
  char *__dest;
  
  if ((this->len != 0) && (this->myStr != (char *)0x0)) {
    operator_delete__(this->myStr);
  }
  uVar1 = right->len;
  __dest = (char *)operator_new__((ulong)(uVar1 + 1));
  this->myStr = __dest;
  strcpy(__dest,right->myStr);
  this->len = uVar1;
  return this;
}

Assistant:

myString &myString::operator=(const myString &right)  {

    if (len != 0)
        delete [] myStr;
    this->myStr = new char[right.size() + 1];
    strcpy(myStr, right.getMyStr());
    len  = right.size();
    return *this;
}